

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O2

int uv_async_send(uv_async_t *handle)

{
  int iVar1;
  int *piVar2;
  anon_union_32_2_8d26fa8b_for_u *paVar3;
  int *busy;
  int *pending;
  uv_async_t *handle_local;
  
  piVar2 = &handle->pending;
  paVar3 = &handle->u;
  if (*piVar2 == 0) {
    LOCK();
    paVar3->fd = paVar3->fd + 1;
    UNLOCK();
    LOCK();
    iVar1 = *piVar2;
    *piVar2 = 1;
    UNLOCK();
    if (iVar1 == 0) {
      uv__async_send(handle->loop);
    }
    LOCK();
    paVar3->fd = paVar3->fd + -1;
    UNLOCK();
  }
  return 0;
}

Assistant:

int uv_async_send(uv_async_t* handle) {
  _Atomic int* pending;
  _Atomic int* busy;

  pending = (_Atomic int*) &handle->pending;
  busy = (_Atomic int*) &handle->u.fd;

  /* Do a cheap read first. */
  if (atomic_load_explicit(pending, memory_order_relaxed) != 0)
    return 0;

  /* Set the loop to busy. */
  atomic_fetch_add(busy, 1);

  /* Wake up the other thread's event loop. */
  if (atomic_exchange(pending, 1) == 0)
    uv__async_send(handle->loop);

  /* Set the loop to not-busy. */
  atomic_fetch_add(busy, -1);

  return 0;
}